

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object___defineGetter__(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue JVar3;
  JSValue JVar4;
  undefined1 auVar5 [16];
  int iVar6;
  JSAtom prop;
  uint uVar7;
  uint uVar8;
  JSRuntime *rt;
  ulong uVar9;
  int64_t iVar10;
  JSValue this_obj;
  JSValueUnion local_68;
  JSValueUnion local_50;
  int64_t iStack_48;
  JSValueUnion local_40;
  
  JVar4 = *argv;
  JVar1 = (JSValueUnion)argv[1].u.ptr;
  iVar2 = argv[1].tag;
  JVar3 = *(JSValue *)&argv[1].u;
  this_obj = JS_ToObject(ctx,this_val);
  uVar9 = 6;
  uVar8 = (uint)this_obj.tag;
  if (uVar8 == 6) goto LAB_00160bec;
  iVar6 = check_function(ctx,JVar3);
  local_68 = this_obj.u;
  if (iVar6 == 0) {
    prop = JS_ValueToAtom(ctx,JVar4);
    if (prop != 0) {
      if (magic == 0) {
        local_40.float64 = local_40.float64 & 0xffffffff00000000;
        iVar6 = 0x4d05;
        iVar10 = 3;
        local_50 = JVar1;
        iStack_48 = iVar2;
      }
      else {
        local_50.float64 = local_50.float64 & 0xffffffff00000000;
        iStack_48 = 3;
        iVar6 = 0x5505;
        iVar10 = iVar2;
        local_40 = JVar1;
      }
      JVar3.tag = iStack_48;
      JVar3.u.ptr = local_50.ptr;
      JVar4.tag = iVar10;
      JVar4.u.ptr = local_40.ptr;
      uVar7 = JS_DefineProperty(ctx,this_obj,prop,(JSValue)(ZEXT816(3) << 0x40),JVar3,JVar4,iVar6);
      if ((0xfffffff4 < uVar8) &&
         (iVar6 = *local_68.ptr, *(int *)local_68.ptr = iVar6 + -1, iVar6 < 2)) {
        __JS_FreeValueRT(ctx->rt,this_obj);
      }
      JS_FreeAtom(ctx,prop);
      uVar9 = (ulong)(uVar7 >> 0x1f) * 3 + 3;
      goto LAB_00160bec;
    }
    if ((uVar8 < 0xfffffff5) ||
       (iVar6 = *local_68.ptr, *(int *)local_68.ptr = iVar6 + -1, 1 < iVar6)) goto LAB_00160bec;
    rt = ctx->rt;
  }
  else {
    if (uVar8 < 0xfffffff5) goto LAB_00160bec;
    iVar6 = *local_68.ptr;
    *(int *)local_68.ptr = iVar6 + -1;
    if (1 < iVar6) goto LAB_00160bec;
    rt = ctx->rt;
  }
  __JS_FreeValueRT(rt,this_obj);
LAB_00160bec:
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar9;
  return (JSValue)(auVar5 << 0x40);
}

Assistant:

static JSValue js_object___defineGetter__(JSContext *ctx, JSValueConst this_val,
                                          int argc, JSValueConst *argv, int magic)
{
    JSValue obj;
    JSValueConst prop, value, get, set;
    int ret, flags;
    JSAtom atom;

    prop = argv[0];
    value = argv[1];

    obj = JS_ToObject(ctx, this_val);
    if (JS_IsException(obj))
        return JS_EXCEPTION;

    if (check_function(ctx, value)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL)) {
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    flags = JS_PROP_THROW |
        JS_PROP_HAS_ENUMERABLE | JS_PROP_ENUMERABLE |
        JS_PROP_HAS_CONFIGURABLE | JS_PROP_CONFIGURABLE;
    if (magic) {
        get = JS_UNDEFINED;
        set = value;
        flags |= JS_PROP_HAS_SET;
    } else {
        get = value;
        set = JS_UNDEFINED;
        flags |= JS_PROP_HAS_GET;
    }
    ret = JS_DefineProperty(ctx, obj, atom, JS_UNDEFINED, get, set, flags);
    JS_FreeValue(ctx, obj);
    JS_FreeAtom(ctx, atom);
    if (ret < 0) {
        return JS_EXCEPTION;
    } else {
        return JS_UNDEFINED;
    }
}